

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

isminetype __thiscall wallet::CWallet::IsMine(CWallet *this,CScript *script)

{
  long lVar1;
  undefined8 *puVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  isminetype iVar3;
  isminetype iVar4;
  const_iterator cVar5;
  LegacyScriptPubKeyMan *pLVar6;
  ScriptPubKeyMan **spkm;
  undefined8 *puVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar5 = std::
          _Hashtable<CScript,_std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_std::allocator<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_cached_spks)._M_h,script);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    pLVar6 = GetLegacyScriptPubKeyMan(this);
    if (pLVar6 != (LegacyScriptPubKeyMan *)0x0) {
      UNRECOVERED_JUMPTABLE =
           (pLVar6->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[3];
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        iVar4 = (*UNRECOVERED_JUMPTABLE)
                          (pLVar6,script,*(long *)(in_FS_OFFSET + 0x28),UNRECOVERED_JUMPTABLE);
        return iVar4;
      }
      goto LAB_00161d3d;
    }
LAB_00161d1f:
    iVar4 = ISMINE_NO;
  }
  else {
    puVar7 = *(undefined8 **)
              ((long)cVar5.
                     super__Node_iterator_base<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_true>
                     ._M_cur + 0x28);
    puVar2 = *(undefined8 **)
              ((long)cVar5.
                     super__Node_iterator_base<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_true>
                     ._M_cur + 0x30);
    if (puVar7 == puVar2) goto LAB_00161d1f;
    iVar4 = ISMINE_NO;
    do {
      iVar3 = (**(code **)(*(long *)*puVar7 + 0x18))((long *)*puVar7,script);
      if (iVar4 <= iVar3) {
        iVar4 = iVar3;
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar4;
  }
LAB_00161d3d:
  __stack_chk_fail();
}

Assistant:

isminetype CWallet::IsMine(const CScript& script) const
{
    AssertLockHeld(cs_wallet);

    // Search the cache so that IsMine is called only on the relevant SPKMs instead of on everything in m_spk_managers
    const auto& it = m_cached_spks.find(script);
    if (it != m_cached_spks.end()) {
        isminetype res = ISMINE_NO;
        for (const auto& spkm : it->second) {
            res = std::max(res, spkm->IsMine(script));
        }
        Assume(res == ISMINE_SPENDABLE);
        return res;
    }

    // Legacy wallet
    if (LegacyScriptPubKeyMan* spkm = GetLegacyScriptPubKeyMan()) {
        return spkm->IsMine(script);
    }

    return ISMINE_NO;
}